

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PopColumnsBackground(void)

{
  ImGuiColumns *pIVar1;
  ImGuiWindow *draw_list;
  ImDrawListSplitter *unaff_retaddr;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  
  draw_list = GetCurrentWindowRead();
  pIVar1 = (draw_list->DC).CurrentColumns;
  if (pIVar1->Count != 1) {
    ImDrawListSplitter::SetCurrentChannel
              (unaff_retaddr,(ImDrawList *)draw_list,(int)((ulong)pIVar1 >> 0x20));
    PopClipRect();
  }
  return;
}

Assistant:

void ImGui::PopColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;
    columns->Splitter.SetCurrentChannel(window->DrawList, columns->Current + 1);
    PopClipRect();
}